

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QPodArrayOps<QStringView>::reallocate
          (QPodArrayOps<QStringView> *this,qsizetype alloc,AllocationOption option)

{
  long lVar1;
  AllocationOption in_EDX;
  qsizetype in_RSI;
  QStringView *in_RDI;
  long in_FS_OFFSET;
  pair<QTypedArrayData<QStringView>_*,_QStringView_*> pVar2;
  pair<QTypedArrayData<QStringView>_*,_QStringView_*> pair;
  QStringView *pQStack_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pVar2 = QTypedArrayData<QStringView>::reallocateUnaligned
                    ((QTypedArrayData<QStringView> *)0xaaaaaaaaaaaaaaaa,in_RDI,in_RSI,in_EDX);
  qt_noop();
  in_RDI->m_size = (qsizetype)pVar2.first;
  pQStack_10 = pVar2.second;
  in_RDI->m_data = (storage_type_conflict *)pQStack_10;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void reallocate(qsizetype alloc, QArrayData::AllocationOption option)
    {
        auto pair = Data::reallocateUnaligned(this->d, this->ptr, alloc, option);
        Q_CHECK_PTR(pair.second);
        Q_ASSERT(pair.first != nullptr);
        this->d = pair.first;
        this->ptr = pair.second;
    }